

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O0

void array_suite::test_double_four(void)

{
  string local_240 [40];
  double dStack_218;
  double array [4];
  undefined1 local_1e8 [8];
  oarchive ar;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  array[1] = 3.5;
  array[2] = 4.5;
  dStack_218 = 1.5;
  array[0] = 2.5;
  boost::archive::detail::interface_oarchive<trial::protocol::json::basic_oarchive<char>>::
  operator<<((interface_oarchive<trial::protocol::json::basic_oarchive<char>> *)local_1e8,
             (double (*) [4])&dStack_218);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[70]>
            ("result.str()",
             "\"[1.50000000000000,2.50000000000000,3.50000000000000,4.50000000000000]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,300,"void array_suite::test_double_four()",local_240,
             "[1.50000000000000,2.50000000000000,3.50000000000000,4.50000000000000]");
  std::__cxx11::string::~string(local_240);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive((basic_oarchive<char> *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_double_four()
{
    std::ostringstream result;
    json::oarchive ar(result);
    double array[] = { 1.5, 2.5, 3.5, 4.5 };
    ar << array;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[1.50000000000000,2.50000000000000,3.50000000000000,4.50000000000000]");
}